

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

bool __thiscall
cmArchiveWrite::AddPath(cmArchiveWrite *this,char *path,size_t skip,char *prefix,bool recursive)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  bool local_132;
  char *file;
  unsigned_long i;
  unsigned_long n;
  size_type end;
  string local_e8 [8];
  string next;
  string local_c0;
  Directory local_a0;
  Directory d;
  string local_90;
  allocator local_59;
  string local_58;
  byte local_31;
  char *pcStack_30;
  bool recursive_local;
  char *prefix_local;
  size_t skip_local;
  char *path_local;
  cmArchiveWrite *this_local;
  
  local_31 = recursive;
  pcStack_30 = prefix;
  prefix_local = (char *)skip;
  skip_local = (size_t)path;
  path_local = (char *)this;
  bVar2 = AddFile(this,path,skip,prefix);
  sVar1 = skip_local;
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_004ca392;
  }
  std::allocator<char>::allocator();
  d.Internal._6_1_ = 0;
  d.Internal._5_1_ = 0;
  std::__cxx11::string::string((string *)&local_58,(char *)sVar1,&local_59);
  bVar2 = cmsys::SystemTools::FileIsDirectory(&local_58);
  sVar1 = skip_local;
  local_132 = true;
  if ((bVar2) && (local_132 = true, (local_31 & 1) != 0)) {
    std::allocator<char>::allocator();
    d.Internal._6_1_ = 1;
    std::__cxx11::string::string
              ((string *)&local_90,(char *)sVar1,(allocator *)((long)&d.Internal + 7));
    d.Internal._5_1_ = 1;
    local_132 = cmsys::SystemTools::FileIsSymlink(&local_90);
  }
  if ((d.Internal._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  if ((d.Internal._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&d.Internal + 7));
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (local_132 != false) {
    this_local._7_1_ = 1;
    goto LAB_004ca392;
  }
  cmsys::Directory::Directory(&local_a0);
  sVar1 = skip_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,(char *)sVar1,(allocator *)(next.field_2._M_local_buf + 0xf));
  bVar2 = cmsys::Directory::Load(&local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)(next.field_2._M_local_buf + 0xf));
  sVar1 = skip_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,(char *)sVar1,(allocator *)((long)&end + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&end + 7));
    std::__cxx11::string::operator+=(local_e8,"/");
    uVar4 = std::__cxx11::string::size();
    pcVar5 = (char *)cmsys::Directory::GetNumberOfFiles(&local_a0);
    for (file = (char *)0x0; file < pcVar5; file = file + 1) {
      pcVar6 = cmsys::Directory::GetFile(&local_a0,(unsigned_long)file);
      iVar3 = strcmp(pcVar6,".");
      if ((iVar3 != 0) && (iVar3 = strcmp(pcVar6,".."), iVar3 != 0)) {
        std::__cxx11::string::erase((ulong)local_e8,uVar4);
        std::__cxx11::string::operator+=(local_e8,pcVar6);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        bVar2 = AddPath(this,pcVar6,(size_t)prefix_local,pcStack_30,true);
        if (!bVar2) {
          this_local._7_1_ = 0;
          bVar2 = true;
          goto LAB_004ca34e;
        }
      }
    }
    bVar2 = false;
LAB_004ca34e:
    std::__cxx11::string::~string(local_e8);
    if (!bVar2) goto LAB_004ca368;
  }
  else {
LAB_004ca368:
    this_local._7_1_ = 1;
  }
  cmsys::Directory::~Directory(&local_a0);
LAB_004ca392:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmArchiveWrite::AddPath(const char* path,
                             size_t skip, const char* prefix,
                             bool recursive)
{
  if(!this->AddFile(path, skip, prefix))
    {
    return false;
    }
  if((!cmSystemTools::FileIsDirectory(path) || !recursive) ||
    cmSystemTools::FileIsSymlink(path))
    {
    return true;
    }
  cmsys::Directory d;
  if(d.Load(path))
    {
    std::string next = path;
    next += "/";
    std::string::size_type end = next.size();
    unsigned long n = d.GetNumberOfFiles();
    for(unsigned long i = 0; i < n; ++i)
      {
      const char* file = d.GetFile(i);
      if(strcmp(file, ".") != 0 && strcmp(file, "..") != 0)
        {
        next.erase(end);
        next += file;
        if(!this->AddPath(next.c_str(), skip, prefix))
          {
          return false;
          }
        }
      }
    }
  return true;
}